

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O1

void Io_NtkWriteOne(FILE *pFile,Abc_Ntk_t *pNtk,int fWriteLatches,int fBb2Wb,int fSeq)

{
  Abc_Obj_t *pNode;
  int iVar1;
  ProgressBar *p;
  Vec_Ptr_t *pVVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  uint nItemsCur;
  int iVar8;
  bool bVar9;
  int local_4c;
  
  fwrite(".inputs",7,1,(FILE *)pFile);
  Io_NtkWritePis(pFile,pNtk,fWriteLatches);
  fputc(10,(FILE *)pFile);
  fwrite(".outputs",8,1,(FILE *)pFile);
  Io_NtkWritePos(pFile,pNtk,fWriteLatches);
  fputc(10,(FILE *)pFile);
  if (pNtk->ntkFunc == ABC_FUNC_BLACKBOX) {
    if (fBb2Wb == 0) {
      fwrite(".blackbox\n",10,1,(FILE *)pFile);
      return;
    }
    Io_NtkWriteConvertedBox(pFile,pNtk,fSeq);
    return;
  }
  Io_WriteTimingInfo(pFile,pNtk);
  if ((fWriteLatches != 0) && (pNtk->nObjCounts[8] != 0)) {
    fputc(10,(FILE *)pFile);
    pVVar2 = pNtk->vBoxes;
    if (0 < pVVar2->nSize) {
      lVar6 = 0;
      do {
        if ((*(uint *)&((Abc_Obj_t *)pVVar2->pArray[lVar6])->field_0x14 & 0xf) == 8) {
          Io_NtkWriteLatch(pFile,(Abc_Obj_t *)pVVar2->pArray[lVar6]);
        }
        lVar6 = lVar6 + 1;
        pVVar2 = pNtk->vBoxes;
      } while (lVar6 < pVVar2->nSize);
    }
    fputc(10,(FILE *)pFile);
  }
  if ((0 < pNtk->nObjCounts[10]) || (0 < pNtk->nObjCounts[9])) {
    fputc(10,(FILE *)pFile);
    pVVar2 = pNtk->vBoxes;
    if (0 < pVVar2->nSize) {
      lVar6 = 0;
      do {
        if ((*(uint *)&((Abc_Obj_t *)pVVar2->pArray[lVar6])->field_0x14 & 0xf) == 10) {
          Io_NtkWriteSubckt(pFile,(Abc_Obj_t *)pVVar2->pArray[lVar6]);
        }
        lVar6 = lVar6 + 1;
        pVVar2 = pNtk->vBoxes;
      } while (lVar6 < pVVar2->nSize);
    }
    fputc(10,(FILE *)pFile);
    pVVar2 = pNtk->vBoxes;
    if (0 < pVVar2->nSize) {
      lVar6 = 0;
      do {
        if ((*(uint *)&((Abc_Obj_t *)pVVar2->pArray[lVar6])->field_0x14 & 0xf) == 9) {
          Io_NtkWriteSubckt(pFile,(Abc_Obj_t *)pVVar2->pArray[lVar6]);
        }
        lVar6 = lVar6 + 1;
        pVVar2 = pNtk->vBoxes;
      } while (lVar6 < pVVar2->nSize);
    }
    fputc(10,(FILE *)pFile);
  }
  local_4c = 0;
  if (pNtk->ntkFunc == ABC_FUNC_MAP) {
    local_4c = Mio_LibraryReadGateNameMax((Mio_Library_t *)pNtk->pManFunc);
  }
  p = Extra_ProgressBarStart(_stdout,pNtk->vObjs->nSize);
  pVVar2 = pNtk->vObjs;
  if (0 < pVVar2->nSize) {
    nItemsCur = 0;
    do {
      if ((int)nItemsCur < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pNode = (Abc_Obj_t *)pVVar2->pArray[nItemsCur];
      if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
        if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= (int)nItemsCur)) {
          Extra_ProgressBarUpdate_int(p,nItemsCur,(char *)0x0);
        }
        if (pNode->pNtk->ntkFunc == ABC_FUNC_MAP) {
          if ((((*(uint *)&pNode->field_0x14 & 0xf) == 7) && ((pNode->vFanins).nSize == 1)) &&
             ((pNode->field_5).pData == (void *)0x0)) {
            fwrite(".barbuf ",8,1,(FILE *)pFile);
            pcVar4 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray]);
            pcVar5 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray])
            ;
            iVar1 = 0;
            fprintf((FILE *)pFile,"%s %s",pcVar4,pcVar5);
          }
          else {
            fwrite(".gate",5,1,(FILE *)pFile);
            iVar1 = Io_NtkWriteNodeGate(pFile,pNode,local_4c);
          }
          fputc(10,(FILE *)pFile);
        }
        else {
          fwrite(".names",6,1,(FILE *)pFile);
          if ((pNode->vFanins).nSize < 1) {
            bVar9 = true;
            iVar1 = 7;
          }
          else {
            iVar1 = 6;
            lVar6 = 0;
            iVar7 = 0;
            do {
              pcVar4 = Abc_ObjName((Abc_Obj_t *)
                                   pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar6]]);
              sVar3 = strlen(pcVar4);
              iVar8 = (int)sVar3 + 1;
              if (iVar7 == 0) {
LAB_0033d6b6:
                iVar7 = 0;
              }
              else if (0x4b < iVar8 + iVar1) {
                fwrite(" \\\n",3,1,(FILE *)pFile);
                iVar1 = 0;
                goto LAB_0033d6b6;
              }
              fprintf((FILE *)pFile," %s",pcVar4);
              iVar1 = iVar1 + iVar8;
              iVar7 = iVar7 + 1;
              lVar6 = lVar6 + 1;
            } while (lVar6 < (pNode->vFanins).nSize);
            bVar9 = iVar7 == 0;
            iVar1 = iVar1 + 1;
          }
          pcVar4 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
          if ((!bVar9) && (sVar3 = strlen(pcVar4), 0x4b < iVar1 + (int)sVar3)) {
            fwrite(" \\\n",3,1,(FILE *)pFile);
          }
          iVar1 = 0;
          fprintf((FILE *)pFile," %s",pcVar4);
          fputc(10,(FILE *)pFile);
          fputs((char *)(pNode->field_5).pData,(FILE *)pFile);
        }
        nItemsCur = nItemsCur + iVar1;
      }
      nItemsCur = nItemsCur + 1;
      pVVar2 = pNtk->vObjs;
    } while ((int)nItemsCur < pVVar2->nSize);
  }
  Extra_ProgressBarStop(p);
  return;
}

Assistant:

void Io_NtkWriteOne( FILE * pFile, Abc_Ntk_t * pNtk, int fWriteLatches, int fBb2Wb, int fSeq )
{
    ProgressBar * pProgress;
    Abc_Obj_t * pNode, * pLatch;
    int i, Length;

    // write the PIs
    fprintf( pFile, ".inputs" );
    Io_NtkWritePis( pFile, pNtk, fWriteLatches );
    fprintf( pFile, "\n" );

    // write the POs
    fprintf( pFile, ".outputs" );
    Io_NtkWritePos( pFile, pNtk, fWriteLatches );
    fprintf( pFile, "\n" );

    // write the blackbox
    if ( Abc_NtkHasBlackbox( pNtk ) )
    {
        if ( fBb2Wb )
            Io_NtkWriteConvertedBox( pFile, pNtk, fSeq );
        else
            fprintf( pFile, ".blackbox\n" );
        return;
    }

    // write the timing info
    Io_WriteTimingInfo( pFile, pNtk );

    // write the latches
    if ( fWriteLatches && !Abc_NtkIsComb(pNtk) )
    {
        fprintf( pFile, "\n" );
        Abc_NtkForEachLatch( pNtk, pLatch, i )
            Io_NtkWriteLatch( pFile, pLatch );
        fprintf( pFile, "\n" );
    }

    // write the subcircuits
//    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );
    if ( Abc_NtkBlackboxNum(pNtk) > 0 || Abc_NtkWhiteboxNum(pNtk) > 0 )
    {
        fprintf( pFile, "\n" );
        Abc_NtkForEachBlackbox( pNtk, pNode, i )
            Io_NtkWriteSubckt( pFile, pNode );
        fprintf( pFile, "\n" );
        Abc_NtkForEachWhitebox( pNtk, pNode, i )
            Io_NtkWriteSubckt( pFile, pNode );
        fprintf( pFile, "\n" );
    }

    // write each internal node
    Length = Abc_NtkHasMapping(pNtk)? Mio_LibraryReadGateNameMax((Mio_Library_t *)pNtk->pManFunc) : 0;
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        if ( Io_NtkWriteNode( pFile, pNode, Length ) ) // skip the next node
            i++;
    }
    Extra_ProgressBarStop( pProgress );
}